

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

int __thiscall ktxValidator::main(ktxValidator *this,int argc,char **argv)

{
  int iVar1;
  pointer filename;
  
  ktxApp::processCommandLine(&this->super_ktxApp,argc,argv,eAllowStdin,eNone);
  (this->logger).quiet = (this->options).quiet;
  (this->logger).maxIssues = *(uint32_t *)&(this->options).super_commandOptions.field_0x44;
  for (filename = (this->options).super_commandOptions.infiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      filename <
      (this->options).super_commandOptions.infiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; filename = filename + 1) {
    validateFile(this,filename);
  }
  iVar1 = 2;
  if (((this->logger).errorCount == 0) &&
     (((this->logger).warningCount == 0 || ((this->options).errorOnWarning == false)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
ktxValidator::main(int argc, char *argv[])
{
    processCommandLine(argc, argv, eAllowStdin);

    logger.quiet = options.quiet;
    logger.maxIssues = options.maxIssues;

    vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
        try {
            validateFile(*it);
        } catch (fatal&) {
            // File could not be opened.
            return 2;
        }
    }
    if (logger.getErrorCount() > 0)
        return 2;
    else if (logger.getWarningCount() > 0 && options.errorOnWarning)
        return 2;
    else
        return 0;
}